

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon_maps.c
# Opt level: O0

void rotate_mirror_map(dw_rom *rom,dw_map_index map_index)

{
  uint8_t uVar1;
  dw_map_meta *pdVar2;
  byte bVar3;
  byte bVar4;
  byte rotatemirror_00;
  dw_dungeon_tile dVar5;
  size_t __nmemb;
  uint64_t uVar6;
  uint8_t *puVar7;
  size_t newi;
  size_t newy;
  size_t newx;
  uint8_t *rotatedbuf;
  uint8_t *mirroredhbuf;
  uint8_t *mirroredvbuf;
  uint8_t *buf;
  ulong uStack_48;
  uint8_t rotatemirror;
  size_t y;
  size_t x;
  size_t i;
  size_t bufsize;
  uint8_t height;
  uint8_t width;
  dw_map_meta *meta;
  dw_map_index map_index_local;
  dw_rom *rom_local;
  
  pdVar2 = (rom->map).meta;
  bVar3 = pdVar2[map_index].width + 1;
  bVar4 = pdVar2[map_index].height + 1;
  __nmemb = (size_t)(int)((uint)bVar3 * (uint)bVar4);
  uVar6 = mt_rand(0,0xf);
  rotatemirror_00 = (byte)uVar6;
  if ((map_index != SWAMP_CAVE) || (rotatemirror_00 != 0)) {
    mirroredhbuf = (uint8_t *)calloc(__nmemb,1);
    for (uStack_48 = 0; uStack_48 < bVar4; uStack_48 = uStack_48 + 1) {
      for (y = 0; y < bVar3; y = y + 1) {
        dVar5 = get_dungeon_tile(rom,map_index,(uint8_t)y,(uint8_t)uStack_48);
        mirroredhbuf[uStack_48 * bVar3 + y] = (uint8_t)dVar5;
      }
    }
    if ((uVar6 & 4) != 0) {
      puVar7 = (uint8_t *)calloc(__nmemb,1);
      for (x = 0; x < __nmemb; x = x + 1) {
        puVar7[x] = mirroredhbuf
                    [(x / bVar3) * (ulong)bVar3 + ((long)(int)(bVar3 - 1) - x % (ulong)bVar3)];
      }
      free(mirroredhbuf);
      mirroredhbuf = puVar7;
    }
    if ((uVar6 & 8) == 0) {
      rotatedbuf = mirroredhbuf;
    }
    else {
      rotatedbuf = (uint8_t *)calloc(__nmemb,1);
      for (x = 0; x < __nmemb; x = x + 1) {
        rotatedbuf[x] =
             mirroredhbuf[((long)(int)(bVar4 - 1) - x / bVar3) * (ulong)bVar3 + x % (ulong)bVar3];
      }
      free(mirroredhbuf);
    }
    if ((uVar6 & 3) == 0) {
      newx = (size_t)rotatedbuf;
    }
    else {
      newx = (size_t)calloc(__nmemb,1);
      if ((rotatemirror_00 & 3) == 1) {
        for (x = 0; x < __nmemb; x = x + 1) {
          *(uint8_t *)(newx + x) =
               rotatedbuf[((long)(int)(bVar4 - 1) - x % (ulong)bVar4) * (ulong)bVar3 + x / bVar4];
        }
      }
      else if ((rotatemirror_00 & 3) == 2) {
        for (x = 0; x < __nmemb; x = x + 1) {
          *(uint8_t *)(newx + x) = rotatedbuf[(__nmemb - 1) - x];
        }
      }
      else if ((rotatemirror_00 & 3) == 3) {
        for (x = 0; x < __nmemb; x = x + 1) {
          *(uint8_t *)(newx + x) =
               rotatedbuf[(x % (ulong)bVar4) * (ulong)bVar3 + ((long)(int)(bVar3 - 1) - x / bVar4)];
        }
      }
      free(rotatedbuf);
    }
    rotate_warps(rom,map_index,rotatemirror_00);
    rotate_chest_positions(rom,map_index,rotatemirror_00);
    if (map_index == SWAMP_CAVE) {
      rotate_forced_encounter(rom,rotatemirror_00);
    }
    if ((uVar6 & 1) != 0) {
      uVar1 = pdVar2[map_index].height;
      pdVar2[map_index].height = pdVar2[map_index].width;
      pdVar2[map_index].width = uVar1;
    }
    for (uStack_48 = 0; uStack_48 <= pdVar2[map_index].height; uStack_48 = uStack_48 + 1) {
      for (y = 0; y <= pdVar2[map_index].width; y = y + 1) {
        set_dungeon_tile(rom,map_index,(uint8_t)y,(uint8_t)uStack_48,
                         *(uint8_t *)
                          (newx + uStack_48 * (long)(int)(pdVar2[map_index].width + 1) + y));
      }
    }
    free((void *)newx);
  }
  return;
}

Assistant:

static void rotate_mirror_map(dw_rom *rom, dw_map_index map_index)
{
    dw_map_meta *meta = &rom->map.meta[map_index];
    const uint8_t width = meta->width+1, height = meta->height+1;
    const size_t bufsize = width * height;
    size_t i, x, y;
    uint8_t rotatemirror, *buf, *mirroredvbuf, *mirroredhbuf, *rotatedbuf;

    rotatemirror = mt_rand(0, 15);
    if (map_index == SWAMP_CAVE)

    if (!rotatemirror)
        return;

    buf = calloc(bufsize, 1);
    for (y=0; y < height; y++) {
        for (x=0; x < width; x++) {
            buf[y * width + x] = get_dungeon_tile(rom, map_index, x, y);
        }
    }
    // MIRRORING
    if (MIRROR_V(rotatemirror)) { // mirror on vertical axis
        mirroredvbuf = calloc(bufsize, 1);
        for (i = 0; i < bufsize; i++) {
            x = width - 1 - (i % width);
            y = i / width;
            mirroredvbuf[i] = buf[y * width + x];
        }
        free(buf);
    } else {
        mirroredvbuf = buf;
    }

    if (MIRROR_H(rotatemirror)) { // mirror on horizontal axis
        mirroredhbuf = calloc(bufsize, 1);
        for (i = 0; i < bufsize; i++) {
            x = i % width;
            y = height - 1 - (i / width);
            mirroredhbuf[i] = mirroredvbuf[y * width + x];
        }
        free(mirroredvbuf); 
    } else {
        mirroredhbuf = mirroredvbuf;
    }

    // ROTATION
    if (!(rotatemirror & 0x3)) {
        rotatedbuf = mirroredhbuf;
    } else {
        size_t newx, newy, newi;
        rotatedbuf = calloc(bufsize, 1);
        if (ROTATE_90(rotatemirror)) { // rotate 90 degrees clockwise
            for (i = 0; i < bufsize; i++) {
                x = i / height;
                y = height - 1 - (i % height);
                rotatedbuf[i] = mirroredhbuf[y * width + x];
            }
        } else if (ROTATE_180(rotatemirror)) { // rotate 180 degrees clockwise
            for (i = 0; i < bufsize; i++) {
                rotatedbuf[i] = mirroredhbuf[bufsize - 1 - i];
            }
        } else if (ROTATE_270(rotatemirror)) { // rotate 270 degrees clockwise
            for (i = 0; i < bufsize; i++) {
                x = width - 1 - (i / height);
                y = i % height;
                rotatedbuf[i] = mirroredhbuf[y * width + x];
            }
        }
        free(mirroredhbuf);
    }
    rotate_warps(rom, map_index, rotatemirror);
    rotate_chest_positions(rom, map_index, rotatemirror);
    if (map_index == SWAMP_CAVE) {
        rotate_forced_encounter(rom, rotatemirror);
    }


    if (rotatemirror & 1) { // rotated 90 or 270, swap w & h
        x = meta->height;
        meta->height = meta->width;
        meta->width = x;
    }

    for (y=0; y <= meta->height; y++) {
        for (x=0; x <= meta->width; x++) {
            set_dungeon_tile(rom, map_index, x, y,
                    rotatedbuf[y * (meta->width+1) + x]);
        }
    }

    free(rotatedbuf);
}